

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_02_PCM.cpp
# Opt level: O0

MXFWriter * __thiscall
AS_02::PCM::MXFWriter::OpenWrite
          (MXFWriter *this,string *filename,WriterInfo *Info,FileDescriptor *essence_descriptor,
          InterchangeObject_list_t *essence_sub_descriptor_list,Rational *edit_rate,
          ui32_t header_size)

{
  FileDescriptor *pFVar1;
  int iVar2;
  ILogSink *pIVar3;
  h__Writer *phVar4;
  Dictionary *d;
  size_type *this_00;
  undefined1 local_b0 [128];
  InterchangeObject_list_t *essence_sub_descriptor_list_local;
  FileDescriptor *essence_descriptor_local;
  WriterInfo *Info_local;
  string *filename_local;
  MXFWriter *this_local;
  Result_t *result;
  
  local_b0._120_8_ = edit_rate;
  essence_sub_descriptor_list_local = essence_sub_descriptor_list;
  essence_descriptor_local = essence_descriptor;
  Info_local = Info;
  filename_local = filename;
  this_local = this;
  if (essence_sub_descriptor_list == (InterchangeObject_list_t *)0x0) {
    pIVar3 = (ILogSink *)Kumu::DefaultLogSink();
    Kumu::ILogSink::Error(pIVar3,"Essence descriptor object required.\n");
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_PARAM);
  }
  else if (((byte)essence_descriptor[0x40] & 1) == 0) {
    phVar4 = (h__Writer *)operator_new(0x5e0);
    d = (Dictionary *)ASDCP::DefaultSMPTEDict();
    h__Writer::h__Writer(phVar4,d);
    this_00 = &filename->_M_string_length;
    ASDCP::mem_ptr<AS_02::PCM::MXFWriter::h__Writer>::operator=
              ((mem_ptr<AS_02::PCM::MXFWriter::h__Writer> *)this_00,phVar4);
    pFVar1 = essence_descriptor_local;
    phVar4 = ASDCP::mem_ptr<AS_02::PCM::MXFWriter::h__Writer>::operator->
                       ((mem_ptr<AS_02::PCM::MXFWriter::h__Writer> *)this_00);
    ASDCP::WriterInfo::operator=
              (&(phVar4->super_h__AS02WriterClip<AS_02::MXF::AS02IndexWriterCBR>).
                super_h__AS02Writer<AS_02::MXF::AS02IndexWriterCBR>.
                super_TrackFileWriter<ASDCP::MXF::OP1aHeader>.m_Info,(WriterInfo *)pFVar1);
    local_b0[0x6b] = 0;
    phVar4 = ASDCP::mem_ptr<AS_02::PCM::MXFWriter::h__Writer>::operator->
                       ((mem_ptr<AS_02::PCM::MXFWriter::h__Writer> *)this_00);
    h__Writer::OpenWrite
              ((h__Writer *)this,(string *)phVar4,(FileDescriptor *)Info_local,
               essence_sub_descriptor_list_local,(ui32_t *)local_b0._120_8_);
    iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
    if (-1 < iVar2) {
      phVar4 = ASDCP::mem_ptr<AS_02::PCM::MXFWriter::h__Writer>::operator->
                         ((mem_ptr<AS_02::PCM::MXFWriter::h__Writer> *)&filename->_M_string_length);
      h__Writer::SetSourceStream((h__Writer *)local_b0,(Rational *)phVar4);
      Kumu::Result_t::operator=((Result_t *)this,(Result_t *)local_b0);
      Kumu::Result_t::~Result_t((Result_t *)local_b0);
    }
    iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
    if (iVar2 < 0) {
      ASDCP::mem_ptr<AS_02::PCM::MXFWriter::h__Writer>::release
                ((mem_ptr<AS_02::PCM::MXFWriter::h__Writer> *)&filename->_M_string_length);
    }
  }
  else {
    pIVar3 = (ILogSink *)Kumu::DefaultLogSink();
    Kumu::ILogSink::Error(pIVar3,"Encryption not supported for ST 382 clip-wrap.\n");
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_NOTIMPL);
  }
  return this;
}

Assistant:

ASDCP::Result_t
AS_02::PCM::MXFWriter::OpenWrite(const std::string& filename, const WriterInfo& Info,
				 ASDCP::MXF::FileDescriptor* essence_descriptor,
				 ASDCP::MXF::InterchangeObject_list_t& essence_sub_descriptor_list,
				 const ASDCP::Rational& edit_rate, ui32_t header_size)
{
  if ( essence_descriptor == 0 )
    {
      DefaultLogSink().Error("Essence descriptor object required.\n");
      return RESULT_PARAM;
    }

  if ( Info.EncryptedEssence )
    {
      DefaultLogSink().Error("Encryption not supported for ST 382 clip-wrap.\n");
      return Kumu::RESULT_NOTIMPL;
    }

  m_Writer = new h__Writer(&DefaultSMPTEDict());
  m_Writer->m_Info = Info;

  Result_t result = m_Writer->OpenWrite(filename, essence_descriptor, essence_sub_descriptor_list, header_size);

  if ( KM_SUCCESS(result) )
    result = m_Writer->SetSourceStream(edit_rate);

  if ( ASDCP_FAILURE(result) )
    m_Writer.release();

  return result;
}